

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_zeropage_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_241840::CpuZeropageTest::run_readwrite_instruction
          (CpuZeropageTest *this,uint8_t instruction,uint8_t new_memory_content)

{
  uint16_t uVar1;
  ushort uVar2;
  code *pcVar3;
  bool bVar4;
  MockSpec<unsigned_char_(unsigned_short)> *pMVar5;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar6;
  MockSpec<void_(unsigned_short,_unsigned_char)> *pMVar7;
  char *message;
  AssertHelper local_200;
  Message local_1f8;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar;
  Matcher<unsigned_char> local_1d8;
  Matcher<unsigned_short> local_1c0;
  MockSpec<void_(unsigned_short,_unsigned_char)> local_1a8;
  WithoutMatchers local_169;
  Matcher<unsigned_char> local_168;
  Matcher<unsigned_short> local_150;
  MockSpec<void_(unsigned_short,_unsigned_char)> local_138;
  ReturnAction<unsigned_char> local_100;
  Action<unsigned_char_(unsigned_short)> local_f0;
  WithoutMatchers local_c9;
  Matcher<unsigned_short> local_c8;
  MockSpec<unsigned_char_(unsigned_short)> local_b0;
  ReturnAction<unsigned_char> local_90;
  Action<unsigned_char_(unsigned_short)> local_80;
  WithoutMatchers local_5d [13];
  Matcher<unsigned_short> local_50;
  MockSpec<unsigned_char_(unsigned_short)> local_38;
  uint8_t local_12;
  uint8_t local_11;
  uint8_t new_memory_content_local;
  CpuZeropageTest *pCStack_10;
  uint8_t instruction_local;
  CpuZeropageTest *this_local;
  
  uVar1 = *(uint16_t *)&(this->super_CpuTest).field_0x112;
  (this->super_CpuTest).expected.pc = uVar1;
  (this->super_CpuTest).registers.pc = uVar1;
  local_12 = new_memory_content;
  local_11 = instruction;
  pCStack_10 = this;
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,instruction);
  uVar2 = (this->super_CpuTest).expected.pc;
  if (SCARRY4((uint)uVar2,1)) {
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  (this->super_CpuTest).expected.pc = uVar2 + 1;
  uVar2 = *(ushort *)&(this->super_CpuTest).field_0x112;
  if (!SCARRY4((uint)uVar2,1)) {
    testing::Matcher<unsigned_short>::Matcher(&local_50,uVar2 + 1);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_38,&(this->super_CpuTest).mmu.super_MockMmu,&local_50);
    testing::internal::GetWithoutMatchers();
    pMVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_38,local_5d,(void *)0x0);
    pTVar6 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_zeropage_instructions.cpp"
                        ,0x2f,"mmu","read_byte(start_pc + 1)");
    testing::Return<unsigned_char>((testing *)&local_90,(this->super_CpuTest).field_0x115);
    testing::internal::ReturnAction::operator_cast_to_Action(&local_80,(ReturnAction *)&local_90);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar6,&local_80);
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_80);
    testing::internal::ReturnAction<unsigned_char>::~ReturnAction(&local_90);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_38);
    testing::Matcher<unsigned_short>::~Matcher(&local_50);
    testing::Matcher<unsigned_short>::Matcher
              (&local_c8,(ushort)(byte)(this->super_CpuTest).field_0x115);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_b0,&(this->super_CpuTest).mmu.super_MockMmu,&local_c8);
    testing::internal::GetWithoutMatchers();
    pMVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_b0,&local_c9,(void *)0x0);
    pTVar6 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_zeropage_instructions.cpp"
                        ,0x31,"mmu","read_byte(effective_address)");
    testing::Return<unsigned_char>((testing *)&local_100,(this->super_CpuTest).field_0x114);
    testing::internal::ReturnAction::operator_cast_to_Action(&local_f0,(ReturnAction *)&local_100);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar6,&local_f0);
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_f0);
    testing::internal::ReturnAction<unsigned_char>::~ReturnAction(&local_100);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_b0);
    testing::Matcher<unsigned_short>::~Matcher(&local_c8);
    testing::Matcher<unsigned_short>::Matcher
              (&local_150,(ushort)(byte)(this->super_CpuTest).field_0x115);
    testing::Matcher<unsigned_char>::Matcher(&local_168,(this->super_CpuTest).field_0x114);
    n_e_s::core::test::MockMmu::gmock_write_byte
              (&local_138,&(this->super_CpuTest).mmu.super_MockMmu,&local_150,&local_168);
    testing::internal::GetWithoutMatchers();
    pMVar7 = testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::operator()
                       (&local_138,&local_169,(void *)0x0);
    testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::InternalExpectedAt
              (pMVar7,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_zeropage_instructions.cpp"
               ,0x34,"mmu","write_byte(effective_address, memory_content)");
    testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::~MockSpec(&local_138);
    testing::Matcher<unsigned_char>::~Matcher(&local_168);
    testing::Matcher<unsigned_short>::~Matcher(&local_150);
    testing::Matcher<unsigned_short>::Matcher
              (&local_1c0,(ushort)(byte)(this->super_CpuTest).field_0x115);
    testing::Matcher<unsigned_char>::Matcher(&local_1d8,local_12);
    n_e_s::core::test::MockMmu::gmock_write_byte
              (&local_1a8,&(this->super_CpuTest).mmu.super_MockMmu,&local_1c0,&local_1d8);
    testing::internal::GetWithoutMatchers();
    pMVar7 = testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::operator()
                       (&local_1a8,
                        (WithoutMatchers *)
                        ((long)&gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        + 7),(void *)0x0);
    testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::InternalExpectedAt
              (pMVar7,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_zeropage_instructions.cpp"
               ,0x35,"mmu","write_byte(effective_address, new_memory_content)");
    testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::~MockSpec(&local_1a8);
    testing::Matcher<unsigned_char>::~Matcher(&local_1d8);
    testing::Matcher<unsigned_short>::~Matcher(&local_1c0);
    n_e_s::core::test::CpuTest::step_execution(&this->super_CpuTest,'\x05');
    testing::internal::EqHelper::
    Compare<n_e_s::core::CpuRegisters,_n_e_s::core::CpuRegisters,_nullptr>
              ((EqHelper *)local_1f0,"expected","registers",&(this->super_CpuTest).expected,
               &(this->super_CpuTest).registers);
    bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
    if (!bVar4) {
      testing::Message::Message(&local_1f8);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
      testing::internal::AssertHelper::AssertHelper
                (&local_200,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_zeropage_instructions.cpp"
                 ,0x38,message);
      testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
      testing::internal::AssertHelper::~AssertHelper(&local_200);
      testing::Message::~Message(&local_1f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
    return;
  }
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

void run_readwrite_instruction(uint8_t instruction,
            uint8_t new_memory_content) {
        registers.pc = expected.pc = start_pc;
        stage_instruction(instruction);
        expected.pc += 1;

        EXPECT_CALL(mmu, read_byte(start_pc + 1))
                .WillOnce(Return(effective_address));
        EXPECT_CALL(mmu, read_byte(effective_address))
                .WillOnce(Return(memory_content));
        // Dummy write
        EXPECT_CALL(mmu, write_byte(effective_address, memory_content));
        EXPECT_CALL(mmu, write_byte(effective_address, new_memory_content));
        step_execution(5);

        EXPECT_EQ(expected, registers);
    }